

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmFileCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  char *__s;
  string local_50;
  
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileCopier_005fbb20;
  (this->super_cmFileCopier).FileCommand = command;
  (this->super_cmFileCopier).Makefile = (command->super_cmCommand).Makefile;
  (this->super_cmFileCopier).Name = "INSTALL";
  (this->super_cmFileCopier).Always = false;
  cmFileTimeComparison::cmFileTimeComparison(&(this->super_cmFileCopier).FileTimes);
  (this->super_cmFileCopier).MatchlessFiles = true;
  (this->super_cmFileCopier).FilePermissions = 0;
  (this->super_cmFileCopier).DirPermissions = 0;
  (this->super_cmFileCopier).MatchRules.
  super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmFileCopier).MatchRules.
  super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmFileCopier).MatchRules.
  super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmFileCopier).CurrentMatchRule = (MatchRule *)0x0;
  (this->super_cmFileCopier).UseGivenPermissionsFile = false;
  (this->super_cmFileCopier).UseGivenPermissionsDir = false;
  (this->super_cmFileCopier).Destination._M_dataplus._M_p =
       (pointer)&(this->super_cmFileCopier).Destination.field_2;
  (this->super_cmFileCopier).Destination._M_string_length = 0;
  (this->super_cmFileCopier).Destination.field_2._M_local_buf[0] = '\0';
  (this->super_cmFileCopier).Files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmFileCopier).Files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_cmFileCopier).Files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_cmFileCopier).Files.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_005fbb98;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xa4 = 4;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  (this->Rename)._M_dataplus._M_p = (pointer)&(this->Rename).field_2;
  (this->Rename)._M_string_length = 0;
  (this->Rename).field_2._M_local_buf[0] = '\0';
  (this->Manifest)._M_dataplus._M_p = (pointer)&(this->Manifest).field_2;
  (this->Manifest)._M_string_length = 0;
  (this->Manifest).field_2._M_local_buf[0] = '\0';
  (this->super_cmFileCopier).UseSourcePermissions = false;
  pcVar2 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS");
  bVar1 = cmSystemTools::IsOn(pcVar2);
  (this->super_cmFileCopier).Always = bVar1;
  this_00 = (this->super_cmFileCopier).Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_INSTALL_MANIFEST_FILES","");
  __s = cmMakefile::GetSafeDefinition(this_00,&local_50);
  pcVar2 = (char *)(this->Manifest)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->Manifest,0,pcVar2,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmFileInstaller(cmFileCommand* command):
    cmFileCopier(command, "INSTALL"),
    InstallType(cmInstallType_FILES),
    Optional(false),
    MessageAlways(false),
    MessageLazy(false),
    MessageNever(false),
    DestDirLength(0)
    {
    // Installation does not use source permissions by default.
    this->UseSourcePermissions = false;
    // Check whether to copy files always or only if they have changed.
    this->Always =
      cmSystemTools::IsOn(cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS"));
    // Get the current manifest.
    this->Manifest =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
    }